

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QCss::StyleRule>::moveAppend
          (QGenericArrayOps<QCss::StyleRule> *this,StyleRule *b,StyleRule *e)

{
  qsizetype *pqVar1;
  StyleRule *pSVar2;
  
  if (b != e) {
    pSVar2 = (this->super_QArrayDataPointer<QCss::StyleRule>).ptr;
    for (; b < e; b = b + 1) {
      QCss::StyleRule::StyleRule(pSVar2 + (this->super_QArrayDataPointer<QCss::StyleRule>).size,b);
      pqVar1 = &(this->super_QArrayDataPointer<QCss::StyleRule>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }